

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O2

void duckdb::
     LeastGreatestFunction<duckdb::hugeint_t,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  long lVar1;
  ulong uVar2;
  reference pvVar3;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t col_idx;
  ulong uVar8;
  long lVar9;
  UnifiedVectorFormat vdata;
  long local_878;
  long local_870;
  bool result_has_value [2048];
  
  lVar5 = *(long *)args;
  lVar9 = *(long *)(args + 8);
  if (lVar9 - lVar5 == 0x68) {
    vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
    duckdb::Vector::Reference(result);
    return;
  }
  for (uVar8 = 0; uVar8 < (ulong)((lVar9 - lVar5) / 0x68); uVar8 = uVar8 + 1) {
    vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,uVar8);
    lVar5 = *(long *)args;
    lVar9 = *(long *)(args + 8);
  }
  lVar1 = *(long *)(result + 0x20);
  uVar8 = 0;
  memset(result_has_value,0,0x800);
  do {
    if ((ulong)((lVar9 - lVar5) / 0x68) <= uVar8) {
      StandardLeastGreatest<false>::FinalizeResult
                (*(idx_t *)(args + 0x18),result_has_value,result,state);
      duckdb::Vector::SetVectorType((VectorType)result);
      return;
    }
    pvVar3 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,uVar8);
    if (*pvVar3 == (value_type)0x2) {
      pvVar3 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,uVar8);
      if ((*(byte **)(pvVar3 + 0x28) == (byte *)0x0) || ((**(byte **)(pvVar3 + 0x28) & 1) != 0))
      goto LAB_00710d1a;
    }
    else {
LAB_00710d1a:
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
      pvVar3 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,uVar8);
      duckdb::Vector::ToUnifiedFormat((ulong)pvVar3,*(UnifiedVectorFormat **)(args + 0x18));
      if (local_870 == 0) {
        plVar4 = (long *)(lVar1 + 8);
        for (uVar6 = 0; uVar6 < *(ulong *)(args + 0x18); uVar6 = uVar6 + 1) {
          uVar7 = uVar6;
          if (*_vdata != 0) {
            uVar7 = (ulong)*(uint *)(*_vdata + uVar6 * 4);
          }
          uVar2 = *(ulong *)(local_878 + uVar7 * 0x10);
          lVar5 = *(long *)(local_878 + 8 + uVar7 * 0x10);
          if (result_has_value[uVar6] == true) {
            if ((*plVar4 < lVar5) || ((ulong)plVar4[-1] < uVar2 && lVar5 == *plVar4))
            goto LAB_00710e12;
          }
          else {
LAB_00710e12:
            result_has_value[uVar6] = true;
            plVar4[-1] = uVar2;
            *plVar4 = lVar5;
          }
          plVar4 = plVar4 + 2;
        }
      }
      else {
        plVar4 = (long *)(lVar1 + 8);
        for (uVar6 = 0; uVar6 < *(ulong *)(args + 0x18); uVar6 = uVar6 + 1) {
          uVar7 = uVar6;
          if (*_vdata != 0) {
            uVar7 = (ulong)*(uint *)(*_vdata + uVar6 * 4);
          }
          if ((*(ulong *)(local_870 + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f) & 1) != 0) {
            uVar2 = *(ulong *)(local_878 + uVar7 * 0x10);
            lVar5 = *(long *)(local_878 + 8 + uVar7 * 0x10);
            if (result_has_value[uVar6] == true) {
              if ((lVar5 <= *plVar4) && (uVar2 <= (ulong)plVar4[-1] || lVar5 != *plVar4))
              goto LAB_00710dbd;
            }
            result_has_value[uVar6] = true;
            plVar4[-1] = uVar2;
            *plVar4 = lVar5;
          }
LAB_00710dbd:
          plVar4 = plVar4 + 2;
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
    }
    uVar8 = uVar8 + 1;
    lVar5 = *(long *)args;
    lVar9 = *(long *)(args + 8);
  } while( true );
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}